

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

int helics::apps::addUsedPotentialInterfaceToCommand
              (json *potentialCommand,
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  value_t vVar1;
  json_value jVar2;
  pointer ppVar3;
  bool bVar4;
  int extraout_EAX;
  reference pvVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar6;
  pointer ppVar7;
  _Hash_node_base *p_Var8;
  initializer_list_t init;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view fmt;
  string_view message;
  format_args args;
  allocator<char> local_139;
  string *local_138;
  int local_12c;
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  enabledInterfaces;
  data local_f8;
  string local_e8;
  char *local_c8;
  size_t local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  size_t local_80;
  key_type local_70;
  key_type local_50;
  
  enabledInterfaces.
  super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabledInterfaces.
  super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enabledInterfaces.
  super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = (potentials->_M_h)._M_before_begin._M_nxt;
  aVar6 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)fed;
  local_138 = type;
  local_12c = logLevel;
  std::__cxx11::string::string((string *)&local_c8,possibleFed);
  for (; p_Var8 != (_Hash_node_base *)0x0; p_Var8 = p_Var8->_M_nxt) {
    __y._M_str = local_c8;
    __y._M_len = local_c0;
    bVar4 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var8 + 3),__y);
    if ((bVar4) && (((ulong)p_Var8[7]._M_nxt & 1) != 0)) {
      CLI::std::
      vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
      ::push_back(&enabledInterfaces,(value_type *)(p_Var8 + 1));
    }
  }
  std::__cxx11::string::~string((string *)&local_c8);
  if (enabledInterfaces.
      super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      enabledInterfaces.
      super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    init._M_len = 0;
    init._M_array = (iterator)&local_f8;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    std::__cxx11::string::string((string *)&local_70,local_138);
    pvVar5 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](potentialCommand,&local_70);
    vVar1 = (pvVar5->m_data).m_type;
    (pvVar5->m_data).m_type = local_f8.m_type;
    jVar2 = (pvVar5->m_data).m_value;
    (pvVar5->m_data).m_value = local_f8.m_value;
    local_f8.m_type = vVar1;
    local_f8.m_value = jVar2;
    std::__cxx11::string::~string((string *)&local_70);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_f8);
    ppVar3 = enabledInterfaces.
             super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = enabledInterfaces.
                  super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1)
    {
      std::__cxx11::string::string((string *)&local_50,local_138);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](potentialCommand,&local_50);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_a8,&(ppVar7->second).key,&local_139);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_e8,&local_a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar5,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_e8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_e8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_50);
      if (8 < local_12c) {
        local_a8._M_dataplus._M_p = (possibleFed->_M_dataplus)._M_p;
        local_a8._M_string_length = possibleFed->_M_string_length;
        local_a8.field_2._M_allocated_capacity = (size_type)(local_138->_M_dataplus)._M_p;
        local_a8.field_2._8_8_ = local_138->_M_string_length;
        local_80 = (ppVar7->first)._M_len;
        local_88 = (ppVar7->first)._M_str;
        fmt.size_ = 0xddd;
        fmt.data_ = (char *)0x19;
        args.field_1.args_ = aVar6.args_;
        args.desc_ = (unsigned_long_long)&local_a8;
        ::fmt::v11::vformat_abi_cxx11_(&local_e8,(v11 *)"federate {} request {} {}",fmt,args);
        message._M_str = local_e8._M_dataplus._M_p;
        message._M_len = local_e8._M_string_length;
        Federate::logMessage(fed,9,message);
        std::__cxx11::string::~string((string *)&local_e8);
      }
    }
  }
  CLI::std::
  _Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  ::~_Vector_base(&enabledInterfaces.
                   super__Vector_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                 );
  return extraout_EAX;
}

Assistant:

static int addUsedPotentialInterfaceToCommand(
    nlohmann::json& potentialCommand,
    const std::unordered_map<std::string_view, PotentialConnections>& potentials,
    const std::string& possibleFed,
    int logLevel,
    const std::string& type,
    Federate* fed)
{
    int interfaceCount{0};
    std::vector<std::remove_cv_t<std::remove_reference_t<decltype(*potentials.begin())>>>
        enabledInterfaces;
    std::copy_if(potentials.begin(),
                 potentials.end(),
                 std::back_inserter(enabledInterfaces),
                 [possibleFed](auto& pInterface) {
                     return (pInterface.second.federate == possibleFed &&
                             pInterface.second.used == true);
                 });
    if (!enabledInterfaces.empty()) {
        potentialCommand[type] = nlohmann::json::array();
        for (const auto& iface : enabledInterfaces) {
            potentialCommand[type].push_back(std::string(iface.second.key));
            ++interfaceCount;
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(
                    HELICS_LOG_LEVEL_CONNECTIONS,
                    fmt::format("federate {} request {} {}", possibleFed, type, iface.first));
            }
        }
    }
    return interfaceCount;
}